

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.cpp
# Opt level: O1

void __thiscall
LocalGraphTest_ObstacleMultiGet_Test::~LocalGraphTest_ObstacleMultiGet_Test
          (LocalGraphTest_ObstacleMultiGet_Test *this)

{
  testing::Test::~Test(&this->super_LocalGraphTest);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(LocalGraphTest, ObstacleMultiGet) {
  auto moduleText = R"wasm(
    (module
      (func $foo
        ;; A set with multiple gets.
        (local $x i32)
        (local.set $x
          (i32.const 10)
        )
        (nop)
        (drop
          (local.get $x)
        )
        (nop)
        (drop
          (local.get $x)
        )
        (nop)
      )
    )
  )wasm";
  Module wasm;
  ASSERT_FALSE(WATParser::parseModule(wasm, moduleText).getErr());
  auto* func = wasm.functions[0].get();
  auto* block = func->body->cast<Block>();
  auto* set = block->list[0]->cast<LocalSet>();
  auto* nopA = block->list[1]->cast<Nop>();
  auto* nopB = block->list[3]->cast<Nop>();
  auto* nopC = block->list[5]->cast<Nop>();

  LazyLocalGraph graph(func, &wasm, Nop::SpecificId);
  // The first nop blocks them both, but not the second, and the third blocks
  // nothing.
  EXPECT_EQ(graph.canMoveSet(set, nopA).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(set, nopB).size(), 1U);
  EXPECT_EQ(graph.canMoveSet(set, nopC).size(), 2U);
}